

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCommandBuffersTests.cpp
# Opt level: O0

TestStatus *
vkt::api::anon_unknown_0::createPoolResetBitTest
          (TestStatus *__return_storage_ptr__,Context *context)

{
  VkDevice device;
  DeviceInterface *vk_00;
  allocator<char> local_89;
  string local_88;
  Move<vk::Handle<(vk::HandleType)24>_> local_68;
  undefined1 local_48 [8];
  VkCommandPoolCreateInfo cmdPoolParams;
  deUint32 queueFamilyIndex;
  DeviceInterface *vk;
  VkDevice vkDevice;
  Context *context_local;
  
  device = Context::getDevice(context);
  vk_00 = Context::getDeviceInterface(context);
  cmdPoolParams.pNext._4_4_ = Context::getUniversalQueueFamilyIndex(context);
  local_48._0_4_ = VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO;
  cmdPoolParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  cmdPoolParams._4_4_ = 0;
  cmdPoolParams.pNext._0_4_ = 2;
  cmdPoolParams.queueFamilyIndex = cmdPoolParams.pNext._4_4_;
  ::vk::createCommandPool
            (&local_68,vk_00,device,(VkCommandPoolCreateInfo *)local_48,(VkAllocationCallbacks *)0x0
            );
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move(&local_68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"Command Pool allocated correctly.",&local_89);
  tcu::TestStatus::pass(__return_storage_ptr__,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createPoolResetBitTest(Context& context)
{
	const VkDevice							vkDevice				= context.getDevice();
	const DeviceInterface&					vk						= context.getDeviceInterface();
	const deUint32							queueFamilyIndex		= context.getUniversalQueueFamilyIndex();

	const VkCommandPoolCreateInfo			cmdPoolParams			=
	{
		VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO,					// sType;
		DE_NULL,													// pNext;
		VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT,			// flags;
		queueFamilyIndex,											// queueFamilyIndex;
	};

	createCommandPool(vk, vkDevice, &cmdPoolParams, DE_NULL);

	return tcu::TestStatus::pass("Command Pool allocated correctly.");
}